

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

void communicate(char *file_memory,Arguments *args)

{
  int iVar1;
  Benchmarks bench;
  Benchmarks local_50;
  
  do {
  } while (*file_memory != 's');
  setup_benchmarks(&local_50);
  if (0 < args->count) {
    iVar1 = 0;
    do {
      local_50.single_start = now();
      memset(file_memory,0x2a,(long)args->size);
      LOCK();
      *file_memory = 'c';
      UNLOCK();
      do {
      } while (*file_memory != 's');
      benchmark(&local_50);
      iVar1 = iVar1 + 1;
    } while (iVar1 < args->count);
  }
  evaluate(&local_50,args);
  return;
}

Assistant:

void communicate(char *file_memory, struct Arguments *args) {
	struct Benchmarks bench;
	int message;
	void *buffer = malloc(args->size);
	atomic_char *guard = (atomic_char *)file_memory;

	mmap_wait(guard);
	setup_benchmarks(&bench);

	for (message = 0; message < args->count; ++message) {
		bench.single_start = now();

		memset(file_memory, '*', args->size);

		mmap_notify(guard);
		mmap_wait(guard);

		memcpy(buffer, file_memory, args->size);

		benchmark(&bench);
	}

	evaluate(&bench, args);
	free(buffer);
}